

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<const_kj::WritableFileMapping> __thiscall
kj::anon_unknown_8::DiskFile::mmapWritable(DiskFile *this,uint64_t offset,uint64_t size)

{
  void *pvVar1;
  AutoCloseFd AVar2;
  uint64_t in_RCX;
  WritableFileMapping *extraout_RDX;
  long lVar3;
  MmapRange MVar4;
  Own<const_kj::WritableFileMapping> OVar5;
  Fault f;
  Fault local_50;
  long local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  
  MVar4 = getMmapRange(size,in_RCX);
  pvVar1 = ::mmap((void *)0x0,MVar4.size,3,1,*(int *)(offset + 8),MVar4.offset);
  if (pvVar1 != (void *)0xffffffffffffffff) {
    lVar3 = (long)pvVar1 + (size - MVar4.offset);
    local_38 = &(anonymous_namespace)::mmapDisposer;
    local_48 = lVar3;
    AVar2 = (AutoCloseFd)operator_new(0x20);
    *(undefined ***)AVar2 = &PTR_get_0044f468;
    *(long *)((long)AVar2 + 8) = lVar3;
    *(uint64_t *)((long)AVar2 + 0x10) = in_RCX;
    *(undefined8 **)((long)AVar2 + 0x18) = &(anonymous_namespace)::mmapDisposer;
    (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
         (_func_int **)
         &_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::instance;
    (this->super_DiskHandle).fd = AVar2;
    OVar5.ptr = extraout_RDX;
    OVar5.disposer = (Disposer *)this;
    return OVar5;
  }
  __errno_location();
  local_50.exception = (Exception *)0x0;
  local_48 = 0;
  uStack_40 = 0;
  _::Debug::Fault::init
            (&local_50,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
  _::Debug::Fault::fatal(&local_50);
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    return DiskHandle::mmapWritable(offset, size);
  }